

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Linker.cpp
# Opt level: O3

void __thiscall
nigel::Linker::printToFile
          (Linker *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *data,path *file)

{
  char *pcVar1;
  long *plVar2;
  undefined8 *puVar3;
  pointer puVar4;
  size_t sVar5;
  ulong *puVar6;
  long *plVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  char cVar9;
  ulong uVar10;
  undefined8 uVar11;
  u8 uVar12;
  ulong uVar13;
  uint uVar14;
  String out;
  String fileStr;
  ofstream filestream;
  long *local_378;
  undefined8 local_370;
  long local_368;
  undefined8 uStack_360;
  long *local_358;
  undefined8 local_350;
  long local_348;
  undefined8 uStack_340;
  ulong *local_338;
  long local_330;
  ulong local_328;
  long lStack_320;
  ulong *local_318;
  long local_310;
  ulong local_308;
  long lStack_300;
  string local_2f8;
  string local_2d8;
  long *local_2b8;
  long local_2b0;
  long local_2a8;
  long lStack_2a0;
  undefined1 *local_298;
  char *local_290;
  undefined1 local_288;
  undefined7 uStack_287;
  string local_278;
  long *local_258 [2];
  long local_248 [2];
  string *local_238;
  undefined1 local_230 [8];
  size_type local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  uint auStack_210 [54];
  ios_base local_138 [264];
  
  local_258[0] = local_248;
  local_238 = (string *)file;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"");
  local_298 = &local_288;
  local_290 = (char *)0x0;
  local_288 = 0;
  puVar4 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish == puVar4) goto LAB_00168088;
  uVar13 = 0;
  cVar9 = '\0';
  uVar14 = 0;
  do {
    helper::int_to_hex<unsigned_char>((string *)local_230,puVar4[uVar13]);
    std::__cxx11::string::_M_append((char *)&local_298,(ulong)local_230);
    if (local_230 != (undefined1  [8])&local_220) {
      operator_delete((void *)local_230,local_220._M_allocated_capacity + 1);
    }
    puVar4 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    cVar9 = cVar9 + puVar4[uVar13];
    if ((char *)0x1f < local_290) {
      uVar12 = (u8)((ulong)local_290 >> 1);
      helper::int_to_hex<unsigned_char>(&local_278,uVar12);
      plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_278,0,(char *)0x0,0x170c58);
      local_338 = &local_328;
      puVar6 = (ulong *)(plVar2 + 2);
      if ((ulong *)*plVar2 == puVar6) {
        local_328 = *puVar6;
        lStack_320 = plVar2[3];
      }
      else {
        local_328 = *puVar6;
        local_338 = (ulong *)*plVar2;
      }
      local_330 = plVar2[1];
      *plVar2 = (long)puVar6;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      helper::int_to_hex<unsigned_short>(&local_2d8,(unsigned_short)uVar14);
      uVar10 = 0xf;
      if (local_338 != &local_328) {
        uVar10 = local_328;
      }
      if (uVar10 < local_2d8._M_string_length + local_330) {
        uVar11 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
          uVar11 = local_2d8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar11 < local_2d8._M_string_length + local_330) goto LAB_001677fc;
        puVar3 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_2d8,0,(char *)0x0,(ulong)local_338);
      }
      else {
LAB_001677fc:
        puVar3 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_338,(ulong)local_2d8._M_dataplus._M_p);
      }
      local_378 = &local_368;
      plVar2 = puVar3 + 2;
      if ((long *)*puVar3 == plVar2) {
        local_368 = *plVar2;
        uStack_360 = puVar3[3];
      }
      else {
        local_368 = *plVar2;
        local_378 = (long *)*puVar3;
      }
      local_370 = puVar3[1];
      *puVar3 = plVar2;
      puVar3[1] = 0;
      *(undefined1 *)plVar2 = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_378);
      local_2b8 = &local_2a8;
      plVar7 = plVar2 + 2;
      if ((long *)*plVar2 == plVar7) {
        local_2a8 = *plVar7;
        lStack_2a0 = plVar2[3];
      }
      else {
        local_2a8 = *plVar7;
        local_2b8 = (long *)*plVar2;
      }
      local_2b0 = plVar2[1];
      *plVar2 = (long)plVar7;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_2b8,(ulong)local_298);
      local_318 = &local_308;
      puVar6 = (ulong *)(plVar2 + 2);
      if ((ulong *)*plVar2 == puVar6) {
        local_308 = *puVar6;
        lStack_300 = plVar2[3];
      }
      else {
        local_308 = *puVar6;
        local_318 = (ulong *)*plVar2;
      }
      local_310 = plVar2[1];
      *plVar2 = (long)puVar6;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      helper::int_to_hex<unsigned_char>
                (&local_2f8,
                 -(cVar9 + uVar12 + (char)((uVar14 & 0xffff) >> 8) + (char)(uVar14 & 0xffff)));
      uVar10 = 0xf;
      if (local_318 != &local_308) {
        uVar10 = local_308;
      }
      if (uVar10 < local_2f8._M_string_length + local_310) {
        uVar11 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
          uVar11 = local_2f8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar11 < local_2f8._M_string_length + local_310) goto LAB_001679aa;
        puVar3 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_2f8,0,(char *)0x0,(ulong)local_318);
      }
      else {
LAB_001679aa:
        puVar3 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_318,(ulong)local_2f8._M_dataplus._M_p);
      }
      plVar2 = puVar3 + 2;
      if ((long *)*puVar3 == plVar2) {
        local_348 = *plVar2;
        uStack_340 = puVar3[3];
        local_358 = &local_348;
      }
      else {
        local_348 = *plVar2;
        local_358 = (long *)*puVar3;
      }
      local_350 = puVar3[1];
      *puVar3 = plVar2;
      puVar3[1] = 0;
      *(undefined1 *)plVar2 = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_358);
      paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 == paVar8) {
        local_220._M_allocated_capacity = paVar8->_M_allocated_capacity;
        local_220._8_8_ = plVar2[3];
        local_230 = (undefined1  [8])&local_220;
      }
      else {
        local_220._M_allocated_capacity = paVar8->_M_allocated_capacity;
        local_230 = (undefined1  [8])*plVar2;
      }
      local_228 = plVar2[1];
      *plVar2 = (long)paVar8;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::__cxx11::string::_M_append((char *)local_258,(ulong)local_230);
      if (local_230 != (undefined1  [8])&local_220) {
        operator_delete((void *)local_230,local_220._M_allocated_capacity + 1);
      }
      if (local_358 != &local_348) {
        operator_delete(local_358,local_348 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
        operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
      }
      if (local_318 != &local_308) {
        operator_delete(local_318,local_308 + 1);
      }
      if (local_2b8 != &local_2a8) {
        operator_delete(local_2b8,local_2a8 + 1);
      }
      if (local_378 != &local_368) {
        operator_delete(local_378,local_368 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
      }
      if (local_338 != &local_328) {
        operator_delete(local_338,local_328 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      pcVar1 = local_290;
      std::__cxx11::string::_M_replace((ulong)&local_298,0,local_290,0x171a40);
      uVar14 = uVar14 + ((uint)((ulong)pcVar1 >> 1) & 0x7fffffff);
      puVar4 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      cVar9 = '\0';
    }
    uVar13 = uVar13 + 1;
  } while (uVar13 < (ulong)((long)(data->
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)puVar4));
  if (local_290 == (char *)0x0) goto LAB_00168088;
  uVar12 = (u8)((ulong)local_290 >> 1);
  helper::int_to_hex<unsigned_char>(&local_278,uVar12);
  plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_278,0,(char *)0x0,0x170c58);
  puVar6 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar6) {
    local_328 = *puVar6;
    lStack_320 = plVar2[3];
    local_338 = &local_328;
  }
  else {
    local_328 = *puVar6;
    local_338 = (ulong *)*plVar2;
  }
  local_330 = plVar2[1];
  *plVar2 = (long)puVar6;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  helper::int_to_hex<unsigned_short>(&local_2d8,(unsigned_short)uVar14);
  uVar13 = 0xf;
  if (local_338 != &local_328) {
    uVar13 = local_328;
  }
  if (uVar13 < local_2d8._M_string_length + local_330) {
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      uVar11 = local_2d8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar11 < local_2d8._M_string_length + local_330) goto LAB_00167ce5;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_2d8,0,(char *)0x0,(ulong)local_338);
  }
  else {
LAB_00167ce5:
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_338,(ulong)local_2d8._M_dataplus._M_p);
  }
  local_378 = &local_368;
  plVar2 = puVar3 + 2;
  if ((long *)*puVar3 == plVar2) {
    local_368 = *plVar2;
    uStack_360 = puVar3[3];
  }
  else {
    local_368 = *plVar2;
    local_378 = (long *)*puVar3;
  }
  local_370 = puVar3[1];
  *puVar3 = plVar2;
  puVar3[1] = 0;
  *(undefined1 *)plVar2 = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_378);
  local_2b8 = &local_2a8;
  plVar7 = plVar2 + 2;
  if ((long *)*plVar2 == plVar7) {
    local_2a8 = *plVar7;
    lStack_2a0 = plVar2[3];
  }
  else {
    local_2a8 = *plVar7;
    local_2b8 = (long *)*plVar2;
  }
  local_2b0 = plVar2[1];
  *plVar2 = (long)plVar7;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_2b8,(ulong)local_298);
  local_318 = &local_308;
  puVar6 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar6) {
    local_308 = *puVar6;
    lStack_300 = plVar2[3];
  }
  else {
    local_308 = *puVar6;
    local_318 = (ulong *)*plVar2;
  }
  local_310 = plVar2[1];
  *plVar2 = (long)puVar6;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  helper::int_to_hex<unsigned_char>
            (&local_2f8,-(cVar9 + uVar12 + (char)((uVar14 & 0xffff) >> 8) + (char)(uVar14 & 0xffff))
            );
  uVar13 = 0xf;
  if (local_318 != &local_308) {
    uVar13 = local_308;
  }
  if (uVar13 < local_2f8._M_string_length + local_310) {
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
      uVar11 = local_2f8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar11 < local_2f8._M_string_length + local_310) goto LAB_00167e8f;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_2f8,0,(char *)0x0,(ulong)local_318);
  }
  else {
LAB_00167e8f:
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_318,(ulong)local_2f8._M_dataplus._M_p);
  }
  local_358 = &local_348;
  plVar2 = puVar3 + 2;
  if ((long *)*puVar3 == plVar2) {
    local_348 = *plVar2;
    uStack_340 = puVar3[3];
  }
  else {
    local_348 = *plVar2;
    local_358 = (long *)*puVar3;
  }
  local_350 = puVar3[1];
  *puVar3 = plVar2;
  puVar3[1] = 0;
  *(undefined1 *)plVar2 = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_358);
  local_230 = (undefined1  [8])&local_220;
  paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 == paVar8) {
    local_220._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_220._8_8_ = plVar2[3];
  }
  else {
    local_220._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_230 = (undefined1  [8])*plVar2;
  }
  local_228 = plVar2[1];
  *plVar2 = (long)paVar8;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_258,(ulong)local_230);
  if (local_230 != (undefined1  [8])&local_220) {
    operator_delete((void *)local_230,local_220._M_allocated_capacity + 1);
  }
  if (local_358 != &local_348) {
    operator_delete(local_358,local_348 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if (local_318 != &local_308) {
    operator_delete(local_318,local_308 + 1);
  }
  if (local_2b8 != &local_2a8) {
    operator_delete(local_2b8,local_2a8 + 1);
  }
  if (local_378 != &local_368) {
    operator_delete(local_378,local_368 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  if (local_338 != &local_328) {
    operator_delete(local_338,local_328 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
LAB_00168088:
  std::__cxx11::string::append((char *)local_258);
  std::ofstream::ofstream(local_230,local_238,_S_bin);
  plVar2 = local_258[0];
  if ((*(uint *)((long)auStack_210 + *(long *)((long)local_230 + -0x18)) & 5) == 0) {
    if (local_258[0] == (long *)0x0) {
      std::ios::clear((int)&local_378 + (int)*(long *)((long)local_230 + -0x18) + 0x148);
    }
    else {
      sVar5 = strlen((char *)local_258[0]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,(char *)plVar2,sVar5);
    }
    std::ofstream::close();
  }
  local_230 = (undefined1  [8])_VTT;
  *(undefined8 *)(local_230 + *(long *)(_VTT + -0x18)) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf((filebuf *)&local_228);
  std::ios_base::~ios_base(local_138);
  if (local_298 != &local_288) {
    operator_delete(local_298,CONCAT71(uStack_287,local_288) + 1);
  }
  if (local_258[0] != local_248) {
    operator_delete(local_258[0],local_248[0] + 1);
  }
  return;
}

Assistant:

void Linker::printToFile( const std::vector<u8>& data, fs::path file )
	{
		String fileStr = "";
		String out;
		u16 startAddr = 0;
		u16 checksum = 0;
		for( size_t i = 0 ; i < data.size() ; i++ )
		{
			out += int_to_hex( data[i] );
			checksum += data[i];

			if( out.size() >= 32 )
			{
				checksum += ( out.size() / 2 ) + ( startAddr & 0xff ) + ( startAddr >> 8 );
				fileStr += ":" + int_to_hex( static_cast< u8 >( out.size() / 2 ) ) + int_to_hex( startAddr ) + "00" + out + int_to_hex( static_cast< u8 >( ~( checksum % 256 )+1 ) ) + "\r\n";
				checksum = 0;
				startAddr += static_cast< u16 >( out.size() / 2 );
				out = "";
            }
		}
		if( out.size() > 0 )
		{
			checksum += ( out.size() / 2 ) + ( startAddr & 0xff ) + ( startAddr >> 8 );
			fileStr += ":" + int_to_hex( static_cast< u8 >( out.size() / 2 ) ) + int_to_hex( startAddr ) + "00" + out + int_to_hex( static_cast< u8 >( ~( checksum % 256 )+1 ) ) + "\r\n";
		}
		fileStr += ":00000001FF";


		std::ofstream filestream( file.string(), std::ios_base::binary );

		if( filestream )
		{
			filestream << fileStr.c_str();
			filestream.close();
		}
	}